

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O1

pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> __thiscall
helics::CallbackFederate::operateCallback(CallbackFederate *this,iteration_time newTime)

{
  ulong uVar1;
  Federate *this_00;
  undefined8 unaff_R12;
  pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> pVar2;
  iteration_time res;
  undefined1 auVar3 [12];
  
  res.grantedTime = newTime.grantedTime.internalTimeCode;
  this_00 = (Federate *)
            ((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
            (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]);
  if (newTime.state == NEXT_STEP && res.grantedTime.internalTimeCode == 0) {
    res._8_8_ = 0;
    Federate::enteringExecutingMode(this_00,res);
  }
  else {
    Federate::postTimeRequestOperations(this_00,res.grantedTime,newTime.state == ITERATING);
  }
  uVar1 = 0;
  if ((this->super_CombinationFederate).super_ValueFederate.field_0x30 != '\0') {
    uVar1 = 0x7fffffffffffffff;
  }
  auVar3._8_4_ = (int)CONCAT71((int7)((ulong)unaff_R12 >> 8),3);
  auVar3._0_8_ = 0x7fffffffffffffff;
  if (res.grantedTime.internalTimeCode <
      *(long *)(&(this->super_CombinationFederate).super_ValueFederate.field_0x30 +
               (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]))
  {
    if (*(long *)&(this->super_CombinationFederate).super_ValueFederate.field_0x68 == 0) {
      if (*(long *)&(this->super_CombinationFederate).super_ValueFederate.field_0x88 == 0) {
        auVar3._8_4_ = 0;
        auVar3._0_8_ = uVar1;
      }
      else {
        uVar1 = (**(code **)&(this->super_CombinationFederate).super_ValueFederate.field_0x90)
                          (&(this->super_CombinationFederate).super_ValueFederate.field_0x78);
        auVar3._8_4_ = 0;
        auVar3._0_8_ = uVar1;
      }
    }
    else {
      auVar3 = (**(code **)&(this->super_CombinationFederate).super_ValueFederate.field_0x70)
                         (&(this->super_CombinationFederate).super_ValueFederate.field_0x58);
    }
  }
  if (auVar3[8] < '\x03') {
    Federate::preTimeRequestOperations
              ((Federate *)
               ((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
               (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]),
               (Time)auVar3._0_8_,auVar3[8] != '\0');
  }
  pVar2._12_4_ = 0;
  pVar2.first.internalTimeCode = auVar3._0_8_;
  pVar2.second = auVar3[8];
  pVar2._9_3_ = auVar3._9_3_;
  return pVar2;
}

Assistant:

std::pair<Time, IterationRequest> CallbackFederate::operateCallback(iteration_time newTime)
{
    if (newTime.grantedTime == timeZero && newTime.state == IterationResult::NEXT_STEP) {
        enteringExecutingMode(newTime);
    } else {
        postTimeRequestOperations(newTime.grantedTime, newTime.state == IterationResult::ITERATING);
    }
    // time zero here is equivalent to the next allowable time
    auto rval = std::make_pair((mEventTriggered) ? Time::maxVal() : timeZero,
                               IterationRequest::NO_ITERATIONS);

    if (newTime.grantedTime >= mStopTime) {
        rval = std::make_pair(Time::maxVal(), IterationRequest::HALT_OPERATIONS);
    } else if (nextTimeOperation1) {
        rval = nextTimeOperation1(newTime);
    } else if (nextTimeOperation2) {
        rval = std::make_pair(nextTimeOperation2(newTime.grantedTime),
                              IterationRequest::NO_ITERATIONS);
    }
    if (rval.second <= IterationRequest::ITERATE_IF_NEEDED) {
        preTimeRequestOperations(rval.first, rval.second != IterationRequest::NO_ITERATIONS);
    }

    return rval;
}